

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  int iVar1;
  int iVar2;
  InternalRunDeathTestFlag *__lhs;
  bool bVar3;
  UnitTestImpl *pUVar4;
  ExecDeathTest *this_00;
  string *this_01;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  DeathTest **local_48;
  RE *local_40;
  int local_34 [2];
  int death_test_index;
  
  local_48 = test;
  local_40 = regex;
  pUVar4 = GetUnitTestImpl();
  __lhs = (pUVar4->internal_run_death_test_flag_).ptr_;
  iVar2 = (pUVar4->current_test_info_->result_).death_test_count_;
  iVar1 = iVar2 + 1;
  (pUVar4->current_test_info_->result_).death_test_count_ = iVar1;
  local_34[0] = iVar1;
  if (__lhs != (InternalRunDeathTestFlag *)0x0) {
    if (__lhs->index_ <= iVar2) {
      StreamableToString<int>(&local_110,local_34);
      std::operator+(&local_d0,"Death test count (",&local_110);
      std::operator+(&local_f0,&local_d0,") somehow exceeded expected maximum (");
      local_6c = __lhs->index_;
      StreamableToString<int>(&local_b0,&local_6c);
      std::operator+(&local_90,&local_f0,&local_b0);
      std::operator+(&local_68,&local_90,")");
      DeathTest::set_last_death_test_message(&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      this_01 = &local_110;
      goto LAB_001b7f51;
    }
    bVar3 = std::operator==(&__lhs->file_,file);
    if (((!bVar3) || (__lhs->line_ != line)) || (__lhs->index_ != iVar1)) {
      *local_48 = (DeathTest *)0x0;
      return true;
    }
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar3) {
    this_00 = (ExecDeathTest *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest(this_00,statement,local_40,file,line);
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar3) {
      std::operator+(&local_90,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_68,&local_90,"\" encountered");
      DeathTest::set_last_death_test_message(&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      this_01 = &local_90;
LAB_001b7f51:
      std::__cxx11::string::~string((string *)this_01);
      return false;
    }
    this_00 = (ExecDeathTest *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest((NoExecDeathTest *)this_00,statement,local_40);
  }
  *local_48 = (DeathTest *)this_00;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }